

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

bool SearchPolylinePart(ON_RTreeNode *a_node,ON_Polyline *polyline,int from,int plcount,
                       ON_RTreeSearchPolylineResultCallback *result)

{
  ON_RTreeBBox *a_rectB;
  uint uVar1;
  ON_3dPoint *pOVar2;
  int *piVar3;
  bool bVar4;
  ON_RTreeBBox *a_rectA;
  int from_00;
  int count;
  long lVar5;
  ulong uVar6;
  uint count_00;
  long lVar7;
  ulong uVar8;
  ON_BoundingBox *bbox;
  ON_BoundingBox local_60;
  
  if (plcount < 3) {
    if (plcount == 2) {
      pOVar2 = (polyline->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
      piVar3 = (int *)(result->super_ON_RTreeSearchResultCallback).m_context;
      if (piVar3 != (int *)0x0) {
        *piVar3 = from;
      }
      bVar4 = SearchHelper(a_node,(ON_Line *)(pOVar2 + (uint)from),
                           &result->super_ON_RTreeSearchResultCallback);
      return bVar4;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_rtree.cpp"
               ,0x4bd,"","Unexpected plcount");
  }
  else {
    uVar1 = a_node->m_count;
    if ((long)(int)uVar1 < 1) {
      return true;
    }
    if (a_node->m_level < 1) {
      lVar5 = 0;
      do {
        uVar6 = (ulong)(plcount - 1);
        lVar7 = (long)from * 0x18;
        uVar8 = (ulong)(uint)from;
        do {
          bVar4 = ON_BoundingBox::IsDisjoint
                            ((ON_BoundingBox *)(a_node->m_branch + lVar5),
                             (ON_Line *)
                             ((long)&((polyline->super_ON_3dPointArray).
                                      super_ON_SimpleArray<ON_3dPoint>.m_a)->x + lVar7),false);
          if (!bVar4) {
            piVar3 = (int *)(result->super_ON_RTreeSearchResultCallback).m_context;
            if (piVar3 != (int *)0x0) {
              *piVar3 = (int)uVar8;
            }
            bVar4 = (*(result->super_ON_RTreeSearchResultCallback).m_resultCallback)
                              (piVar3,(ON__INT_PTR)
                                      ((ON_BoundingBox *)(a_node->m_branch + lVar5))[1].m_min.x);
            if (!bVar4) {
              return false;
            }
          }
          uVar8 = (ulong)((int)uVar8 + 1);
          lVar7 = lVar7 + 0x18;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
        lVar5 = lVar5 + 1;
      } while (lVar5 != (int)uVar1);
    }
    else {
      count_00 = plcount + 1U >> 1;
      a_rectA = (ON_RTreeBBox *)ON_Workspace::GetMemory(result->m_ws,0x60);
      ON_3dPointArray::BoundingBox(&local_60,&polyline->super_ON_3dPointArray,from,count_00);
      a_rectA->m_max[1] = local_60.m_max.y;
      a_rectA->m_max[2] = local_60.m_max.z;
      a_rectA->m_min[2] = local_60.m_min.z;
      a_rectA->m_max[0] = local_60.m_max.x;
      a_rectA->m_min[0] = local_60.m_min.x;
      a_rectA->m_min[1] = local_60.m_min.y;
      from_00 = count_00 + from + -1;
      count = (plcount - count_00) + 1;
      ON_3dPointArray::BoundingBox(&local_60,&polyline->super_ON_3dPointArray,from_00,count);
      a_rectA[1].m_max[1] = local_60.m_max.y;
      a_rectA[1].m_max[2] = local_60.m_max.z;
      a_rectA[1].m_min[2] = local_60.m_min.z;
      a_rectA[1].m_max[0] = local_60.m_max.x;
      a_rectA[1].m_min[0] = local_60.m_min.x;
      a_rectA[1].m_min[1] = local_60.m_min.y;
      lVar5 = 0;
      do {
        a_rectB = (ON_RTreeBBox *)((long)a_node->m_branch[0].m_rect.m_min + lVar5);
        bVar4 = OverlapHelper(a_rectA,a_rectB);
        if (((bVar4) &&
            (bVar4 = SearchPolylinePart(*(ON_RTreeNode **)
                                         ((long)(&a_node->m_branch[0].m_rect + 1) + lVar5),polyline,
                                        from,count_00,result), !bVar4)) ||
           ((bVar4 = OverlapHelper(a_rectA + 1,a_rectB), bVar4 &&
            (bVar4 = SearchPolylinePart(*(ON_RTreeNode **)
                                         ((long)(&a_node->m_branch[0].m_rect + 1) + lVar5),polyline,
                                        from_00,count,result), !bVar4)))) {
          return false;
        }
        lVar5 = lVar5 + 0x38;
      } while ((ulong)uVar1 * 0x38 - lVar5 != 0);
    }
  }
  return true;
}

Assistant:

static bool SearchPolylinePart(const ON_RTreeNode* a_node, const ON_Polyline* polyline, int from, int plcount,
  ON_RTreeSearchPolylineResultCallback& result)
{
  if (plcount > 2)
  {
    int i, count, innercount;

    if ((count = a_node->m_count) > 0)
    {
      const ON_RTreeBranch* branch = a_node->m_branch;
      if (a_node->IsInternalNode())
      {
        innercount = (plcount + 1) / 2;
        auto bb = (ON_BoundingBox*)result.m_ws->GetMemory(sizeof(ON_BoundingBox) * 2);
        *bb = polyline->BoundingBox(from, innercount);
        *(bb + 1) = polyline->BoundingBox(from + innercount - 1, plcount - innercount + 1);

        for (i = 0; i < count; ++i)
        {
          if (OverlapHelper((ON_RTreeBBox*)bb, &branch[i].m_rect))
          {
            if (!SearchPolylinePart(branch[i].m_child, polyline, from, innercount, result))
            {
              return false; // Don't continue searching
            }
          }
          if (OverlapHelper((ON_RTreeBBox*)bb+1, &branch[i].m_rect))
          {
            if (!SearchPolylinePart(branch[i].m_child, polyline, from + innercount - 1, plcount - innercount + 1, result))
            {
              return false; // Don't continue searching
            }
          }
        }
      }
      else
      {
        // a_node is a leaf node
        for (i = 0; i < count; ++i)
        {
          for (innercount = 0; innercount < (plcount-1); innercount++)
          {
            ON_Line* line = (ON_Line*)(&polyline->Array()[innercount + from]);
            if (OverlapLineHelper(line, &branch[i].m_rect))
            {
              if (result.m_context) ((ON_RTreePolylineContext*)result.m_context)->m_polyline_pointindex = innercount + from;
              if (!result.m_resultCallback(result.m_context, branch[i].m_id))
              {
                // callback canceled search
                return false;
              }
            }
          }
        }
      }
    }
  }
  else if (plcount == 2)
  {
    ON_Line* line = (ON_Line*)(&polyline->Array()[from]);
    if (result.m_context) ((ON_RTreePolylineContext*)result.m_context)->m_polyline_pointindex = from;
    return SearchHelper(a_node, line, result);
  }
  else if (plcount < 2)
  {
    ON_ERROR("Unexpected plcount");
    return true;
  }

  return true;
}